

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.h
# Opt level: O3

void __thiscall
embree::avx::CurveGeometryInterface<embree::BezierCurveT>::interpolate_impl<4>
          (CurveGeometryInterface<embree::BezierCurveT> *this,RTCInterpolateArguments *args)

{
  uint uVar1;
  uint uVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  char *pcVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  vector<BufferView<Vec3ff>_> *pvVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  float fVar22;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar23 [16];
  float fVar27;
  float fVar29;
  float fVar30;
  undefined1 auVar28 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  uVar1 = args->valueCount;
  pvVar17 = &(this->super_CurveGeometry).vertices;
  if (args->bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
    pvVar17 = (vector<BufferView<Vec3ff>_> *)&(this->super_CurveGeometry).vertexAttribs;
  }
  if (uVar1 != 0) {
    pfVar3 = args->P;
    pfVar4 = args->dPdu;
    pfVar5 = args->ddPdudu;
    pcVar6 = pvVar17->items[args->bufferSlot].super_RawBufferView.ptr_ofs;
    uVar18 = (ulong)(uint)pvVar17->items[args->bufferSlot].super_RawBufferView.stride;
    fVar22 = args->u;
    uVar2 = args->primID;
    auVar7 = vpshufd_avx(ZEXT416(uVar1),0);
    fVar29 = 1.0 - fVar22;
    fVar25 = fVar29 * fVar29;
    fVar26 = fVar22 * fVar22;
    fVar27 = fVar26 * 3.0;
    auVar9 = vshufps_avx(ZEXT416((uint)(fVar29 * fVar25)),ZEXT416((uint)(fVar29 * fVar25)),0);
    auVar34 = ZEXT416((uint)(fVar22 * 3.0 * fVar25));
    auVar34 = vshufps_avx(auVar34,auVar34,0);
    auVar10 = vshufps_avx(ZEXT416((uint)(fVar27 * fVar29)),ZEXT416((uint)(fVar27 * fVar29)),0);
    auVar11 = vshufps_avx(ZEXT416((uint)(fVar22 * fVar26)),ZEXT416((uint)(fVar22 * fVar26)),0);
    fVar24 = fVar22 * fVar29 + fVar22 * fVar29;
    auVar12 = vshufps_avx(ZEXT416((uint)(fVar25 * -3.0)),ZEXT416((uint)(fVar25 * -3.0)),0);
    auVar35 = ZEXT416((uint)((fVar25 - fVar24) * 3.0));
    auVar35 = vshufps_avx(auVar35,auVar35,0);
    auVar36 = ZEXT416((uint)((fVar24 - fVar26) * 3.0));
    auVar36 = vshufps_avx(auVar36,auVar36,0);
    auVar13 = vshufps_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27),0);
    auVar14 = vshufps_avx(ZEXT416((uint)(fVar29 * 6.0)),ZEXT416((uint)(fVar29 * 6.0)),0);
    auVar28 = ZEXT416((uint)((fVar22 - (fVar29 + fVar29)) * 6.0));
    auVar28 = vshufps_avx(auVar28,auVar28,0);
    auVar37 = ZEXT416((uint)((fVar29 - (fVar22 + fVar22)) * 6.0));
    auVar37 = vshufps_avx(auVar37,auVar37,0);
    auVar15 = vshufps_avx(ZEXT416((uint)(fVar22 * 6.0)),ZEXT416((uint)(fVar22 * 6.0)),0);
    uVar19 = 0;
    do {
      uVar21 = (ulong)*(uint *)(*(long *)&(this->super_CurveGeometry).super_Geometry.field_0x58 +
                               *(long *)&(this->super_CurveGeometry).field_0x68 * (ulong)uVar2);
      uVar20 = (ulong)uVar19;
      auVar8 = vpshufd_avx(ZEXT416(uVar19),0);
      auVar8 = vpor_avx(auVar8,_DAT_01f7fcf0);
      auVar8 = vpcmpgtd_avx(auVar7,auVar8);
      auVar32 = vmaskmovps_avx(auVar8,*(undefined1 (*) [16])(pcVar6 + uVar20 * 4 + uVar18 * uVar21))
      ;
      auVar33 = vmaskmovps_avx(auVar8,*(undefined1 (*) [16])
                                       (pcVar6 + uVar20 * 4 + (uVar21 + 1) * uVar18));
      auVar23 = vmaskmovps_avx(auVar8,*(undefined1 (*) [16])
                                       (pcVar6 + uVar20 * 4 + (uVar21 + 2) * uVar18));
      auVar16 = vmaskmovps_avx(auVar8,*(undefined1 (*) [16])
                                       (pcVar6 + uVar20 * 4 + (uVar21 + 3) * uVar18));
      fVar38 = auVar33._0_4_;
      fVar39 = auVar33._4_4_;
      fVar40 = auVar33._8_4_;
      fVar41 = auVar33._12_4_;
      fVar42 = auVar32._0_4_;
      fVar43 = auVar32._4_4_;
      fVar44 = auVar32._8_4_;
      fVar45 = auVar32._12_4_;
      fVar27 = auVar16._0_4_;
      fVar29 = auVar16._4_4_;
      fVar30 = auVar16._8_4_;
      fVar31 = auVar16._12_4_;
      fVar22 = auVar23._0_4_;
      fVar24 = auVar23._4_4_;
      fVar25 = auVar23._8_4_;
      fVar26 = auVar23._12_4_;
      if (pfVar3 != (float *)0x0) {
        local_68 = auVar11._0_4_;
        fStack_64 = auVar11._4_4_;
        fStack_60 = auVar11._8_4_;
        fStack_5c = auVar11._12_4_;
        local_58 = auVar10._0_4_;
        fStack_54 = auVar10._4_4_;
        fStack_50 = auVar10._8_4_;
        fStack_4c = auVar10._12_4_;
        local_48 = auVar34._0_4_;
        fStack_44 = auVar34._4_4_;
        fStack_40 = auVar34._8_4_;
        fStack_3c = auVar34._12_4_;
        local_38 = auVar9._0_4_;
        fStack_34 = auVar9._4_4_;
        fStack_30 = auVar9._8_4_;
        fStack_2c = auVar9._12_4_;
        auVar32._0_4_ =
             fVar42 * local_38 + fVar38 * local_48 + fVar22 * local_58 + fVar27 * local_68;
        auVar32._4_4_ =
             fVar43 * fStack_34 + fVar39 * fStack_44 + fVar24 * fStack_54 + fVar29 * fStack_64;
        auVar32._8_4_ =
             fVar44 * fStack_30 + fVar40 * fStack_40 + fVar25 * fStack_50 + fVar30 * fStack_60;
        auVar32._12_4_ =
             fVar45 * fStack_2c + fVar41 * fStack_3c + fVar26 * fStack_4c + fVar31 * fStack_5c;
        auVar32 = vmaskmovps_avx(auVar8,auVar32);
        *(undefined1 (*) [16])(pfVar3 + uVar20) = auVar32;
      }
      if (pfVar4 != (float *)0x0) {
        auVar33._0_4_ =
             fVar42 * auVar12._0_4_ +
             fVar38 * auVar35._0_4_ + auVar36._0_4_ * fVar22 + auVar13._0_4_ * fVar27;
        auVar33._4_4_ =
             fVar43 * auVar12._4_4_ +
             fVar39 * auVar35._4_4_ + auVar36._4_4_ * fVar24 + auVar13._4_4_ * fVar29;
        auVar33._8_4_ =
             fVar44 * auVar12._8_4_ +
             fVar40 * auVar35._8_4_ + auVar36._8_4_ * fVar25 + auVar13._8_4_ * fVar30;
        auVar33._12_4_ =
             fVar45 * auVar12._12_4_ +
             fVar41 * auVar35._12_4_ + auVar36._12_4_ * fVar26 + auVar13._12_4_ * fVar31;
        auVar32 = vmaskmovps_avx(auVar8,auVar33);
        *(undefined1 (*) [16])(pfVar4 + uVar20) = auVar32;
      }
      if (pfVar5 != (float *)0x0) {
        auVar23._0_4_ =
             auVar14._0_4_ * fVar42 +
             auVar28._0_4_ * fVar38 + auVar37._0_4_ * fVar22 + auVar15._0_4_ * fVar27;
        auVar23._4_4_ =
             auVar14._4_4_ * fVar43 +
             auVar28._4_4_ * fVar39 + auVar37._4_4_ * fVar24 + auVar15._4_4_ * fVar29;
        auVar23._8_4_ =
             auVar14._8_4_ * fVar44 +
             auVar28._8_4_ * fVar40 + auVar37._8_4_ * fVar25 + auVar15._8_4_ * fVar30;
        auVar23._12_4_ =
             auVar14._12_4_ * fVar45 +
             auVar28._12_4_ * fVar41 + auVar37._12_4_ * fVar26 + auVar15._12_4_ * fVar31;
        auVar8 = vmaskmovps_avx(auVar8,auVar23);
        *(undefined1 (*) [16])(pfVar5 + uVar20) = auVar8;
      }
      uVar19 = uVar19 + 4;
    } while (uVar19 < uVar1);
  }
  return;
}

Assistant:

void interpolate_impl(const RTCInterpolateArguments* const args)
    {
      unsigned int primID = args->primID;
      float u = args->u;
      RTCBufferType bufferType = args->bufferType;
      unsigned int bufferSlot = args->bufferSlot;
      float* P = args->P;
      float* dPdu = args->dPdu;
      float* ddPdudu = args->ddPdudu;
      unsigned int valueCount = args->valueCount;
      
      /* calculate base pointer and stride */
      assert((bufferType == RTC_BUFFER_TYPE_VERTEX && bufferSlot < numTimeSteps) ||
             (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE && bufferSlot <= vertexAttribs.size()));
      const char* src = nullptr; 
      size_t stride = 0;
      if (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
        src    = vertexAttribs[bufferSlot].getPtr();
        stride = vertexAttribs[bufferSlot].getStride();
      } else {
        src    = vertices[bufferSlot].getPtr();
        stride = vertices[bufferSlot].getStride();
      }

      for (unsigned int i=0; i<valueCount; i+=N)
      {
        size_t ofs = i*sizeof(float);
        const size_t index = curves[primID];
        const vbool<N> valid = vint<N>((int)i)+vint<N>(step) < vint<N>((int)valueCount);
        const vfloat<N> p0 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+0)*stride+ofs]);
        const vfloat<N> p1 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+1)*stride+ofs]);
        const vfloat<N> p2 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+2)*stride+ofs]);
        const vfloat<N> p3 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+3)*stride+ofs]);
        
        const Curve<vfloat<N>> curve(p0,p1,p2,p3);
        if (P      ) mem<vfloat<N>>::storeu(valid,P+i,      curve.eval(u));
        if (dPdu   ) mem<vfloat<N>>::storeu(valid,dPdu+i,   curve.eval_du(u));
        if (ddPdudu) mem<vfloat<N>>::storeu(valid,ddPdudu+i,curve.eval_dudu(u));
      }
    }